

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderSourceReplaceCase::test(ShaderSourceReplaceCase *this)

{
  GLenum GVar1;
  TestLog *this_00;
  RenderContext *renderCtx;
  MessageBuilder *pMVar2;
  MessageBuilder local_3e0;
  MessageBuilder local_260;
  char *local_e0;
  char *secondSource;
  char *firstSource;
  string secondSourceStr;
  undefined1 local_a0 [8];
  string firstSourceStr;
  Shader shader;
  TestLog *log;
  ShaderSourceReplaceCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  renderCtx = Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  glu::Shader::Shader((Shader *)((long)&firstSourceStr.field_2 + 8),renderCtx,this->m_shaderType);
  generateFirstSource_abi_cxx11_((string *)local_a0,this);
  generateSecondSource_abi_cxx11_((string *)&firstSource,this);
  secondSource = (char *)std::__cxx11::string::c_str();
  local_e0 = (char *)std::__cxx11::string::c_str();
  tcu::TestLog::operator<<(&local_260,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [23])"Setting shader source.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  glu::Shader::setSources((Shader *)((long)&firstSourceStr.field_2 + 8),1,&secondSource,(int *)0x0);
  GVar1 = glu::CallLogWrapper::glGetError(&(this->super_ApiCase).super_CallLogWrapper);
  glu::checkError(GVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x29c);
  tcu::TestLog::operator<<(&local_3e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_3e0,(char (*) [25])"Replacing shader source.");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e0);
  glu::Shader::setSources((Shader *)((long)&firstSourceStr.field_2 + 8),1,&local_e0,(int *)0x0);
  GVar1 = glu::CallLogWrapper::glGetError(&(this->super_ApiCase).super_CallLogWrapper);
  glu::checkError(GVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x2a1);
  verifyShaderSourceReplaced
            (this,(Shader *)((long)&firstSourceStr.field_2 + 8),(string *)local_a0,
             (string *)&firstSource);
  std::__cxx11::string::~string((string *)&firstSource);
  std::__cxx11::string::~string((string *)local_a0);
  glu::Shader::~Shader((Shader *)((long)&firstSourceStr.field_2 + 8));
  return;
}

Assistant:

void test (void)
	{
		TestLog&			log				= m_testCtx.getLog();

		glu::Shader			shader			(m_context.getRenderContext(), m_shaderType);

		const std::string	firstSourceStr	= generateFirstSource();
		const std::string	secondSourceStr	= generateSecondSource();

		const char*			firstSource		= firstSourceStr.c_str();
		const char*			secondSource	= secondSourceStr.c_str();

		log << TestLog::Message << "Setting shader source." << TestLog::EndMessage;

		shader.setSources(1, &firstSource, 0);
		GLU_CHECK();

		log << TestLog::Message << "Replacing shader source." << TestLog::EndMessage;

		shader.setSources(1, &secondSource, 0);
		GLU_CHECK();

		verifyShaderSourceReplaced(shader, firstSourceStr, secondSourceStr);
	}